

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

lu_mem checklist(global_State *g,int maybedead,int tof,GCObject *newl,GCObject *survival,
                GCObject *old,GCObject *reallyold)

{
  lu_mem local_40;
  int local_34;
  
  local_40 = 0;
  local_34 = maybedead;
  if (newl != survival) {
    do {
      checkobject(g,newl,local_34,0);
      incifingray(g,newl,&local_40);
      if ((bool)((newl->marked & 0x40) >> 6) == (tof == 0)) {
        __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1ed,
                      "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                     );
      }
      newl = newl->next;
    } while (newl != survival);
  }
  if (survival != old) {
    do {
      checkobject(g,survival,0,1);
      incifingray(g,survival,&local_40);
      if ((bool)((survival->marked & 0x40) >> 6) == (tof == 0)) {
        __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1f2,
                      "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                     );
      }
      survival = survival->next;
    } while (survival != old);
  }
  if (old != reallyold) {
    do {
      checkobject(g,old,0,3);
      incifingray(g,old,&local_40);
      if ((bool)((old->marked & 0x40) >> 6) == (tof == 0)) {
        __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1f7,
                      "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                     );
      }
      old = old->next;
    } while (old != reallyold);
  }
  if (reallyold != (GCObject *)0x0) {
    do {
      checkobject(g,reallyold,0,4);
      incifingray(g,reallyold,&local_40);
      if ((bool)((reallyold->marked & 0x40) >> 6) == (tof == 0)) {
        __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1fc,
                      "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                     );
      }
      reallyold = reallyold->next;
    } while (reallyold != (GCObject *)0x0);
  }
  return local_40;
}

Assistant:

static lu_mem checklist (global_State *g, int maybedead, int tof,
  GCObject *newl, GCObject *survival, GCObject *old, GCObject *reallyold) {
  GCObject *o;
  lu_mem total = 0;  /* number of object that should be in  gray lists */
  for (o = newl; o != survival; o = o->next) {
    checkobject(g, o, maybedead, G_NEW);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = survival; o != old; o = o->next) {
    checkobject(g, o, 0, G_SURVIVAL);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = old; o != reallyold; o = o->next) {
    checkobject(g, o, 0, G_OLD1);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = reallyold; o != NULL; o = o->next) {
    checkobject(g, o, 0, G_OLD);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  return total;
}